

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo_tests.cpp
# Opt level: O3

void density_tests::lifo_tests
               (QueueTesterFlags i_flags,ostream *i_output,uint32_t i_random_seed,size_t i_depth,
               size_t i_fork_depth)

{
  uint64_t uVar1;
  ulong uVar2;
  pointer pTVar3;
  long lVar4;
  char *i_label;
  long lVar5;
  ulong uVar6;
  EasyRandom *this;
  iterator __begin1;
  pointer pTVar7;
  iterator __end1;
  ulong uVar8;
  pointer pTVar9;
  vector<ThreadEntry,_std::allocator<ThreadEntry>_> threads;
  ScopedLeakCheck scoped_leak_check;
  PrintScopeDuration duration;
  EasyRandom main_random;
  vector<ThreadEntry,_std::allocator<ThreadEntry>_> local_1458;
  pointer local_1438;
  long *local_1430;
  pointer local_1428;
  id local_1420;
  ScopedLeakCheck local_1418;
  ulong local_1410;
  ostream *local_1408;
  size_t local_1400;
  size_t local_13f8;
  PrintScopeDuration local_13f0;
  EasyRandom local_13c0;
  
  i_label = "lifo_tests with exceptions";
  if ((i_flags & eTestExceptions) == eNone) {
    i_label = "lifo_tests";
  }
  local_1408 = i_output;
  local_1400 = i_depth;
  local_13f8 = i_fork_depth;
  PrintScopeDuration::PrintScopeDuration(&local_13f0,i_output,i_label);
  InstanceCounted::ScopedLeakCheck::ScopedLeakCheck(&local_1418);
  if (i_random_seed == 0) {
    EasyRandom::EasyRandom(&local_13c0);
  }
  else {
    local_13c0.m_rand._M_x[0] = (unsigned_long)i_random_seed;
    lVar4 = 1;
    uVar2 = local_13c0.m_rand._M_x[0];
    do {
      uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar4);
      local_13c0.m_rand._M_x[lVar4] = uVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x270);
    local_13c0.m_rand._M_p = 0x270;
    local_13c0.m_deterministic = true;
  }
  uVar1 = get_num_of_processors();
  local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x7590);
  local_1410 = (ulong)-(uint)((i_flags & eReserveCoreToMainThread) == eNone || uVar1 < 4) |
               0xfffffffffffffffd;
  local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
       super__Vector_impl_data._M_start + 6;
  lVar4 = 0;
  local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
       super__Vector_impl_data._M_start;
  do {
    pTVar7 = local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      if ((long)local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
                super__Vector_impl_data._M_start == 0x7ffffffffffff188) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar5 = (long)local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl
                    .super__Vector_impl_data._M_start >> 3;
      uVar6 = lVar5 * 0x51a8a00d10bd72bb;
      local_1438 = local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
                   super__Vector_impl_data._M_start;
      uVar2 = uVar6;
      if (local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar2 = 1;
      }
      uVar8 = uVar2 + uVar6;
      if (0x6885eb95d7fca < uVar8) {
        uVar8 = 0x6885eb95d7fcb;
      }
      if (CARRY8(uVar2,uVar6)) {
        uVar8 = 0x6885eb95d7fcb;
      }
      if (uVar8 == 0) {
        pTVar3 = (pointer)0x0;
      }
      else {
        pTVar3 = (pointer)operator_new(uVar8 * 0x1398);
      }
      this = (EasyRandom *)((pTVar3->m_random).m_rand._M_x + lVar5);
      EasyRandom::fork(this);
      this[1].m_rand._M_x[0] = 0;
      local_1428 = pTVar3;
      for (pTVar9 = local_1438; pTVar7 != pTVar9; pTVar9 = pTVar9 + 1) {
        memcpy(pTVar3,pTVar9,0x1390);
        (pTVar3->m_thread)._M_id._M_thread = (pTVar9->m_thread)._M_id._M_thread;
        (pTVar9->m_thread)._M_id._M_thread = 0;
        pTVar3 = pTVar3 + 1;
      }
      if (local_1438 != (pointer)0x0) {
        operator_delete(local_1438);
      }
      local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
      super__Vector_impl_data._M_start = local_1428;
      local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1428 + uVar8;
    }
    else {
      EasyRandom::fork(&(local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->m_random);
      (pTVar7->m_thread)._M_id._M_thread = 0;
      pTVar3 = pTVar7;
    }
    pTVar7 = local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar3 = pTVar3 + 1;
    lVar4 = lVar4 + 1;
    local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar3;
  } while (lVar4 != 6);
  lVar4 = 0;
  pTVar9 = local_1458.super__Vector_base<ThreadEntry,_std::allocator<ThreadEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    local_1420._M_thread = 0;
    local_1430 = (long *)operator_new(0x40);
    *local_1430 = (long)&PTR___State_01067ac0;
    local_1430[1] = (long)pTVar9;
    local_1430[2] = (long)local_1408;
    local_1430[3] = lVar4;
    local_1430[4] = local_1410;
    *(QueueTesterFlags *)(local_1430 + 5) = i_flags;
    local_1430[6] = local_1400;
    local_1430[7] = local_13f8;
    std::thread::_M_start_thread(&local_1420,&local_1430,0);
    if (local_1430 != (long *)0x0) {
      (**(code **)(*local_1430 + 8))();
    }
    if ((pTVar9->m_thread)._M_id._M_thread != 0) break;
    (pTVar9->m_thread)._M_id._M_thread = local_1420._M_thread;
    lVar4 = lVar4 + 1;
    pTVar9 = pTVar9 + 1;
    if (lVar4 == 6) {
      for (; pTVar7 != pTVar3; pTVar7 = pTVar7 + 1) {
        std::thread::join();
      }
      std::vector<ThreadEntry,_std::allocator<ThreadEntry>_>::~vector(&local_1458);
      InstanceCounted::ScopedLeakCheck::~ScopedLeakCheck(&local_1418);
      PrintScopeDuration::~PrintScopeDuration(&local_13f0);
      return;
    }
  }
  std::terminate();
}

Assistant:

void lifo_tests(
      QueueTesterFlags i_flags,
      std::ostream &   i_output,
      uint32_t         i_random_seed,
      size_t           i_depth,
      size_t           i_fork_depth)
    {
        PrintScopeDuration duration(
          i_output,
          i_flags && QueueTesterFlags::eTestExceptions ? "lifo_tests with exceptions"
                                                       : "lifo_tests");

        /* this checks that TestObject's don't leak. Note: the instance counting is not thread local, so we have to scope the thread
            procedures inside it. */
        InstanceCounted::ScopedLeakCheck scoped_leak_check;

        EasyRandom main_random = i_random_seed == 0 ? EasyRandom() : EasyRandom(i_random_seed);

        auto const num_of_processors = get_num_of_processors();
        bool const reserve_core1_to_main =
          (i_flags && QueueTesterFlags::eReserveCoreToMainThread) && num_of_processors >= 4;
        uint64_t affinity_mask = std::numeric_limits<uint64_t>::max();
        if (reserve_core1_to_main)
            affinity_mask -= 2;

        // create thread entries - here we pay the cost of forking the random generator
        const size_t thread_count = 6;
        struct ThreadEntry
        {
            EasyRandom  m_random;
            std::thread m_thread;
            ThreadEntry(EasyRandom & i_main_random) : m_random(i_main_random.fork()) {}
        };
        std::vector<ThreadEntry> threads;
        threads.reserve(thread_count);
        for (size_t thread_index = 0; thread_index < thread_count; thread_index++)
        {
            threads.emplace_back(main_random);
        }

#ifdef DENSITY_USER_DATA_STACK
        density::user_data_stack::stats_header(i_output);
#endif

        // start threads
        for (size_t thread_index = 0; thread_index < thread_count; thread_index++)
        {
            auto & thread_entry   = threads[thread_index];
            auto & thread_random  = thread_entry.m_random;
            thread_entry.m_thread = std::thread([&thread_random,
                                                 &i_output,
                                                 thread_index,
                                                 affinity_mask,
                                                 i_flags,
                                                 i_depth,
                                                 i_fork_depth] {
                set_thread_affinity(affinity_mask);

                lifo_test_thread_proc(i_flags, thread_random, i_depth, i_fork_depth);

                std::ostringstream thread_name_stream;
                thread_name_stream << "thread " << thread_index;
                std::string thread_name = thread_name_stream.str();

                std::ostringstream stats_stream;
#ifdef DENSITY_USER_DATA_STACK
                density::user_data_stack::stats_print(stats_stream, thread_name.c_str());
#else
                stats_stream << thread_name << " has finished\n";
#endif
                i_output << stats_stream.str();
                i_output.flush();
            });
        }

        // join threads
        for (auto & thread_entry : threads)
        {
            thread_entry.m_thread.join();
        }
    }